

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen_value.c
# Opt level: O2

CgreenValue * make_cgreen_string_value(CgreenValue *__return_storage_ptr__,char *string)

{
  size_t sVar1;
  char *__dest;
  
  *(undefined8 *)__return_storage_ptr__ = 1;
  (__return_storage_ptr__->value).integer_value = 0;
  __return_storage_ptr__->value_size = 8;
  if (string == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(string);
    __dest = (char *)malloc(sVar1 + 1);
    strcpy(__dest,string);
  }
  (__return_storage_ptr__->value).pointer_value = __dest;
  return __return_storage_ptr__;
}

Assistant:

CgreenValue make_cgreen_string_value(const char *string) {
    CgreenValue value = {CGREEN_STRING, {0}, sizeof(const char *)};
    value.value.string_value = stringdup(string);
    return value;
}